

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>::grow
          (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *this,size_t MinSize)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  pair<void_*,_unsigned_long> *Dest;
  iterator ppVar4;
  iterator ppVar5;
  pair<void_*,_unsigned_long> *NewElts;
  uint64_t local_20;
  size_t NewCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *this_local;
  
  NewCapacity = MinSize;
  MinSize_local = (size_t)this;
  if (0xffffffff < MinSize) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  local_20 = NextPowerOf2(sVar2 + 2);
  puVar3 = std::max<unsigned_long>(&local_20,&NewCapacity);
  NewElts = (pair<void_*,_unsigned_long> *)0xffffffff;
  puVar3 = std::min<unsigned_long>(puVar3,(unsigned_long *)&NewElts);
  local_20 = *puVar3;
  Dest = (pair<void_*,_unsigned_long> *)safe_malloc(local_20 << 4);
  ppVar4 = SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>::begin
                     (&this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>
                     );
  ppVar5 = SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>::end
                     (&this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>
                     );
  SmallVectorTemplateBase<std::pair<void*,unsigned_long>,false>::
  uninitialized_move<std::pair<void*,unsigned_long>*,std::pair<void*,unsigned_long>*>
            (ppVar4,ppVar5,Dest);
  ppVar4 = SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>::begin
                     (&this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>
                     );
  ppVar5 = SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>::end
                     (&this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>
                     );
  destroy_range(ppVar4,ppVar5);
  bVar1 = SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>::isSmall
                    (&this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>)
  ;
  if (!bVar1) {
    ppVar4 = SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>::begin
                       (&this->
                         super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>);
    free(ppVar4);
  }
  (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
  super_SmallVectorBase.BeginX = Dest;
  (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
  super_SmallVectorBase.Capacity = (uint)local_20;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}